

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

void __thiscall kj::anon_unknown_9::DiskHandle::sync(DiskHandle *this)

{
  int iVar1;
  Fault f;
  Fault local_10;
  
  do {
    iVar1 = fsync((this->fd).fd);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  kj::_::Debug::Fault::Fault
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x148,iVar1,"fsync(fd)","");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

void sync() const {
#if __APPLE__
    // For whatever reason, fsync() on OSX only flushes kernel buffers. It does not flush hardware
    // disk buffers. This makes it not very useful. But OSX documents fcntl F_FULLFSYNC which does
    // the right thing. Why they don't just make fsync() do the right thing, I do not know.
    KJ_SYSCALL(fcntl(fd, F_FULLFSYNC));
#else
    KJ_SYSCALL(fsync(fd));
#endif
  }